

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O1

void __thiscall hrvo::Simulator::Simulator(Simulator *this)

{
  KdTree *this_00;
  
  this->defaults_ = (Agent *)0x0;
  this_00 = (KdTree *)operator_new(0x38);
  KdTree::KdTree(this_00,this);
  this->kdTree_ = this_00;
  this->globalTime_ = 0.0;
  this->timeStep_ = 0.0;
  this->reachedGoals_ = false;
  (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Simulator::Simulator()
    : defaults_(NULL),
      kdTree_(new KdTree(this)),
      globalTime_(0.0F),
      timeStep_(0.0F),
      reachedGoals_(false) {}